

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O3

void SHMRemoveNamedObject(SHMPTR shmNamedObject)

{
  LPVOID pvVar1;
  LPVOID pvVar2;
  SHMPTR SVar3;
  LPVOID pvVar4;
  
  if (PAL_InitializeChakraCoreCalled) {
    SHMLock();
    SVar3 = SHMGetInfo(SIID_NAMED_OBJECTS);
    pvVar4 = SHMPtrToPtr(SVar3);
    if (pvVar4 != (LPVOID)0x0) {
      SVar3 = *(SHMPTR *)((long)pvVar4 + 0x18);
      pvVar2 = pvVar4;
      while (pvVar1 = pvVar4, SVar3 != shmNamedObject) {
        pvVar4 = SHMPtrToPtr(*(SHMPTR *)((long)pvVar1 + 8));
        if (pvVar4 == (LPVOID)0x0) goto LAB_0033f7b7;
        SVar3 = *(SHMPTR *)((long)pvVar4 + 0x18);
        pvVar2 = pvVar1;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0033f7e6;
      if (*(SHMPTR *)((long)pvVar2 + 0x18) == shmNamedObject) {
        SHMSetInfo(SIID_NAMED_OBJECTS,*(SHMPTR *)((long)pvVar1 + 8));
      }
      else {
        pvVar4 = SHMPtrToPtr(*(SHMPTR *)((long)pvVar1 + 8));
        if (pvVar4 == (LPVOID)0x0) {
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        else {
          *(undefined8 *)((long)pvVar2 + 8) = *(undefined8 *)((long)pvVar1 + 8);
        }
      }
    }
LAB_0033f7b7:
    lock_count.m_val = lock_count.m_val + -1;
    CCLock::Leave(&shm_critsec);
    return;
  }
LAB_0033f7e6:
  abort();
}

Assistant:

void SHMRemoveNamedObject( SHMPTR shmNamedObject )
{
    PSHM_NAMED_OBJECTS pshmLast = 0;
    PSHM_NAMED_OBJECTS pshmCurrent = 0;

    TRACE( "Entered SHMDeleteNamedObject shmNamedObject = %d\n", shmNamedObject );
    SHMLock();

    pshmCurrent =
        (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( SHMGetInfo( SIID_NAMED_OBJECTS ) );
    pshmLast = pshmCurrent;

    while ( pshmCurrent )
    {
        if ( pshmCurrent->ShmSelf == shmNamedObject )
        {
            TRACE( "Patching the list.\n" );

            /* Patch the list, and delete the object. */
            if ( pshmLast->ShmSelf == pshmCurrent->ShmSelf )
            {
                /* Either the first element or no elements left. */
                SHMSetInfo( SIID_NAMED_OBJECTS, pshmCurrent->ShmNext );
            }
            else if ( (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( pshmCurrent->ShmNext ) )
            {
                pshmLast->ShmNext = pshmCurrent->ShmNext;
            }
            else
            {
                /* Only one left. */
                pshmLast->ShmNext = 0;
            }

            break;
        }
        else
        {
            pshmLast = pshmCurrent;
            pshmCurrent = (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( pshmCurrent->ShmNext );
        }
    }

    SHMRelease();
    return;
}